

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool cinemo::getWaveFiles
               (string *dir,
               vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *workFiles)

{
  DIR *this;
  vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *dir_00;
  bool bVar1;
  char *pcVar2;
  LameWrapper *this_00;
  size_type sVar3;
  allocator local_91;
  string local_90 [32];
  LameWrapper *local_70 [3];
  allocator local_51;
  string local_50 [32];
  dirent *local_30;
  dirent *dirIt;
  DIR *workDir;
  vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *workFiles_local;
  string *dir_local;
  
  workDir = (DIR *)workFiles;
  workFiles_local = (vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)dir;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  dirIt = (dirent *)opendir(pcVar2);
  if (dirIt == (dirent *)0x0) {
    dir_local._7_1_ = false;
  }
  else {
    while (local_30 = readdir((DIR *)dirIt), local_30 != (dirent *)0x0) {
      pcVar2 = local_30->d_name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,pcVar2,&local_51);
      bVar1 = isValidFileType((string *)local_50,extWave);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      this = workDir;
      if (bVar1) {
        this_00 = (LameWrapper *)operator_new(0x90);
        dir_00 = workFiles_local;
        pcVar2 = local_30->d_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,pcVar2,&local_91);
        LameWrapper::LameWrapper(this_00,(string *)dir_00,(string *)local_90);
        local_70[0] = this_00;
        std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::push_back
                  ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)this,
                   local_70);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
      }
    }
    sVar3 = std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::size
                      ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)
                       workDir);
    dir_local._7_1_ = sVar3 != 0;
  }
  return dir_local._7_1_;
}

Assistant:

bool getWaveFiles(const string& dir, vector<LameWrapper*>& workFiles) {
        DIR* workDir = opendir(dir.c_str());
        if (workDir == nullptr) {
            return false;
        }

        dirent* dirIt;
        while ((dirIt = readdir(workDir)) != nullptr) {
            if (isValidFileType(dirIt->d_name, extWave)) {
                workFiles.push_back(new LameWrapper(dir, dirIt->d_name));
            }
        }

        return workFiles.size() > 0;
    }